

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O1

void __thiscall MetaSim::Simulation::run(Simulation *this,Tick endTick,int nRuns)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  Tick TVar5;
  
  if (nRuns < -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initialize stats",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    bVar1 = true;
    uVar3 = 1;
    bVar2 = false;
    goto LAB_0015fce5;
  }
  if (nRuns == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"One single run",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    uVar3 = 1;
LAB_0015fce2:
    bVar2 = true;
    bVar1 = true;
  }
  else {
    if (nRuns == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Last Sim in the batch",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      bVar2 = true;
    }
    else {
      if (nRuns != -1) {
        uVar3 = (ulong)(uint)nRuns;
        goto LAB_0015fce2;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Will not initialize stats",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      bVar2 = false;
    }
    uVar3 = 1;
    bVar1 = false;
  }
LAB_0015fce5:
  this->numRuns = uVar3;
  if (uVar3 == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: Simulation cannot be initialized with 2 runs",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"         Executing 3 runs!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    this->numRuns = 3;
  }
  if (bVar1) {
    BaseStat::init((EVP_PKEY_CTX *)(long)(int)this->numRuns);
    (this->globTime).v = 0;
    this->end = false;
  }
  this->actRuns = 0;
  if (this->numRuns != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n Run #",7);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      (this->globTime).v = 0;
      Entity::callNewRun();
      BaseStat::newRun();
      TVar5.v = (this->globTime).v;
      while (TVar5.v < endTick.v) {
        TVar5 = sim_step(this);
        (this->globTime).v = TVar5.v;
      }
      Entity::callEndRun();
      BaseStat::endRun();
      clearEventQueue(this);
      uVar3 = this->actRuns + 1;
      this->actRuns = uVar3;
    } while (uVar3 < this->numRuns);
  }
  this->end = true;
  if (bVar2) {
    BaseStat::endSim();
    return;
  }
  return;
}

Assistant:

void Simulation::run(Tick endTick, int nRuns) 
    {
        DBGENTER(_SIMUL_DBG_LEV);
        bool initializeRuns = true;
        bool terminateSim = true;
	
        if (nRuns < -1) {
            cout << "Initialize stats" << endl;
            initializeRuns = true;
            terminateSim = false;
            numRuns = 1;
            nRuns = -nRuns;
        }
        else if (nRuns == -1) {
            cout << "Will not initialize stats" << endl;
            initializeRuns = false;
            terminateSim = false;
            numRuns = 1;
        }
        else if (nRuns == 0) {
            cout << "Last Sim in the batch" << endl;
            initializeRuns = false;
            terminateSim = true;
            numRuns = 1;	    
        }
        else if (nRuns == 1) {
            cout << "One single run" << endl;
            initializeRuns = true;
            terminateSim = true; 
            numRuns = 1;	    
        }
        else numRuns = nRuns;

        if (numRuns == 2) {
            cout << "Warning: Simulation cannot be "
                "initialized with 2 runs" << endl;
            cout << "         Executing 3 runs!" << endl;
            numRuns = 3;
        }

        if (initializeRuns) initRuns(numRuns);

        // Ok, now starts the main cycle of the simulation.
        // remember that actRuns is the actual run number
        // while numRuns is the maximum number of runs.
        actRuns = 0;
        while (actRuns < numRuns) {
            cout << "\n Run #" << actRuns << endl;

            initSingleRun();

            // MAIN CYCLE!!
            try {
                while (globTime < endTick) {
                    globTime = sim_step();
                }
            } catch (NoMoreEventsInQueue &e) {
                cerr << "No more events in queue: simulation time =" 
                     << globTime << endl;
            }

            endSingleRun();
                                
            actRuns++;   // next run....
        }
        end = true;
        if (terminateSim) endSim();      // the simulation is over!!
    }